

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load_logisim.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_18860d::LogisimParser::~LogisimParser(LogisimParser *this)

{
  LogisimParser *this_local;
  
  CircuitConstruction::~CircuitConstruction(&this->m_context);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>_>_>
  ::~unordered_map(&this->m_circuits);
  return;
}

Assistant:

LogisimParser(pugi::xml_document *xml_doc, LSimContext *lsim_context) : 
            m_xml_doc(xml_doc), 
            m_lsim_context(lsim_context) {
    }